

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

optional<unsigned_int>
wasm::String::anon_unknown_0::takeWTF16CodePoint(string_view *str,bool allowWTF)

{
  bool bVar1;
  unsigned_short *puVar2;
  int local_3c;
  ushort local_38;
  ushort local_36;
  _Optional_payload_base<unsigned_short> local_34;
  uint16_t lowBits;
  uint16_t highBits;
  optional<unsigned_short> low;
  string_view next;
  optional<unsigned_short> u;
  bool allowWTF_local;
  string_view *str_local;
  
  next._M_str._7_1_ = allowWTF;
  next._M_str._2_4_ = (_Optional_payload_base<unsigned_short>)takeWTF16CodeUnit(str);
  bVar1 = std::optional::operator_cast_to_bool((optional *)((long)&next._M_str + 2));
  if (!bVar1) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&str_local);
    return (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_base<unsigned_int,_true,_true>)str_local;
  }
  puVar2 = std::optional<unsigned_short>::operator*
                     ((optional<unsigned_short> *)((long)&next._M_str + 2));
  if ((*puVar2 < 0xd800) ||
     (puVar2 = std::optional<unsigned_short>::operator*
                         ((optional<unsigned_short> *)((long)&next._M_str + 2)), 0xdbff < *puVar2))
  {
    if (((next._M_str._7_1_ & 1) == 0) &&
       ((puVar2 = std::optional<unsigned_short>::operator*
                            ((optional<unsigned_short> *)((long)&next._M_str + 2)), 0xdbff < *puVar2
        && (puVar2 = std::optional<unsigned_short>::operator*
                               ((optional<unsigned_short> *)((long)&next._M_str + 2)),
           *puVar2 < 0xe000)))) {
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)&str_local);
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)str_local;
    }
  }
  else {
    _lowBits = str->_M_len;
    next._M_len = (size_t)str->_M_str;
    local_34 = (_Optional_payload_base<unsigned_short>)takeWTF16CodeUnit((string_view *)&lowBits);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_34);
    if (((bVar1) &&
        (puVar2 = std::optional<unsigned_short>::operator*((optional<unsigned_short> *)&local_34),
        0xdbff < *puVar2)) &&
       (puVar2 = std::optional<unsigned_short>::operator*((optional<unsigned_short> *)&local_34),
       *puVar2 < 0xe000)) {
      str->_M_len = _lowBits;
      str->_M_str = (char *)next._M_len;
      puVar2 = std::optional<unsigned_short>::operator*
                         ((optional<unsigned_short> *)((long)&next._M_str + 2));
      local_36 = *puVar2 + 0x2800;
      puVar2 = std::optional<unsigned_short>::operator*((optional<unsigned_short> *)&local_34);
      local_38 = *puVar2 + 0x2400;
      local_3c = ((uint)local_36 << 10 | (uint)local_38) + 0x10000;
      std::optional<unsigned_int>::optional<int,_true>
                ((optional<unsigned_int> *)&str_local,&local_3c);
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)str_local;
    }
    if ((next._M_str._7_1_ & 1) == 0) {
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)&str_local);
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)str_local;
    }
  }
  puVar2 = std::optional<unsigned_short>::operator*
                     ((optional<unsigned_short> *)((long)&next._M_str + 2));
  std::optional<unsigned_int>::optional<unsigned_short_&,_true>
            ((optional<unsigned_int> *)&str_local,puVar2);
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)str_local;
}

Assistant:

std::optional<uint32_t> takeWTF16CodePoint(std::string_view& str,
                                           bool allowWTF = true) {
  auto u = takeWTF16CodeUnit(str);
  if (!u) {
    return std::nullopt;
  }

  if (0xD800 <= *u && *u < 0xDC00) {
    // High surrogate; take the next low surrogate if it exists.
    auto next = str;
    auto low = takeWTF16CodeUnit(next);
    if (low && 0xDC00 <= *low && *low < 0xE000) {
      str = next;
      uint16_t highBits = *u - 0xD800;
      uint16_t lowBits = *low - 0xDC00;
      return 0x10000 + ((highBits << 10) | lowBits);
    } else if (!allowWTF) {
      // Unpaired high surrogate.
      return std::nullopt;
    }
  } else if (!allowWTF && 0xDC00 <= *u && *u < 0xE000) {
    // Unpaired low surrogate.
    return std::nullopt;
  }

  return *u;
}